

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shufflechannel.cpp
# Opt level: O0

int __thiscall
ncnn::ShuffleChannel::forward(ShuffleChannel *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar1;
  int dst_q;
  int src_q;
  int j;
  int i;
  size_t feature_sz;
  int channels_per_group;
  int _group;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *m;
  Mat *m_1;
  Allocator *in_stack_fffffffffffffd10;
  size_t in_stack_fffffffffffffd18;
  undefined8 in_stack_fffffffffffffd20;
  undefined8 in_stack_fffffffffffffd28;
  Mat *in_stack_fffffffffffffd30;
  int local_2ac;
  void *local_2a0;
  int *local_298;
  ulong local_290;
  undefined4 local_288;
  long *local_280;
  int local_278;
  int local_274;
  int local_270;
  undefined4 local_26c;
  undefined4 local_268;
  ulong local_260;
  void *local_248;
  int *local_240;
  ulong local_238;
  undefined4 local_230;
  long *local_228;
  int local_220;
  int local_21c;
  int local_218;
  undefined4 local_214;
  undefined4 local_210;
  ulong local_208;
  int local_200;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  size_t local_1f0;
  int local_1e8;
  int local_1e4;
  long local_1e0;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  long *local_1c0;
  long *local_1b8;
  int local_1a4;
  long *local_1a0;
  undefined1 local_195;
  int local_194;
  void **local_188;
  void **local_180;
  undefined1 local_175;
  int local_174;
  long *local_170;
  void **local_168;
  void **local_160;
  void **local_148;
  void **local_138;
  long *local_128;
  long *local_120;
  undefined4 local_114;
  ulong local_110;
  void *local_108;
  undefined4 local_fc;
  int local_f8;
  int local_f4;
  void **local_f0;
  long *local_e8;
  undefined4 local_dc;
  ulong local_d8;
  void *local_d0;
  undefined4 local_c4;
  int local_c0;
  int local_bc;
  void **local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  int local_80;
  undefined4 local_7c;
  void **local_78;
  int local_60;
  undefined4 local_5c;
  void **local_58;
  void *local_20;
  void *local_10;
  
  local_1cc = *(int *)((long)in_RSI + 0x2c);
  local_1d0 = (int)in_RSI[6];
  local_1d4 = (int)in_RSI[7];
  local_1e0 = in_RSI[2];
  if (local_1d4 % *(int *)(in_RDI + 0xd0) == 0) {
    if (*(int *)(in_RDI + 0xd4) == 0) {
      local_2ac = *(int *)(in_RDI + 0xd0);
    }
    else {
      local_2ac = local_1d4 / *(int *)(in_RDI + 0xd0);
    }
    local_1e4 = local_2ac;
    local_1e8 = local_1d4 / local_2ac;
    local_1c0 = in_RDX;
    local_1b8 = in_RSI;
    Mat::create(in_stack_fffffffffffffd30,(int)((ulong)in_stack_fffffffffffffd28 >> 0x20),
                (int)in_stack_fffffffffffffd28,(int)((ulong)in_stack_fffffffffffffd20 >> 0x20),
                in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    local_1a0 = local_1c0;
    bVar1 = true;
    if (*local_1c0 != 0) {
      local_128 = local_1c0;
      bVar1 = local_1c0[8] * (long)(int)local_1c0[7] == 0;
    }
    if (bVar1) {
      local_1a4 = -100;
    }
    else {
      local_1f0 = (long)local_1cc * (long)local_1d0 * local_1e0;
      for (local_1f4 = 0; local_1f4 < local_1e4; local_1f4 = local_1f4 + 1) {
        for (local_1f8 = 0; local_1f8 < local_1e8; local_1f8 = local_1f8 + 1) {
          local_1fc = local_1e8 * local_1f4 + local_1f8;
          local_200 = local_1e4 * local_1f8 + local_1f4;
          local_188 = &local_248;
          local_bc = *(int *)((long)local_1c0 + 0x2c);
          local_c0 = (int)local_1c0[6];
          local_c4 = *(undefined4 *)((long)local_1c0 + 0x34);
          local_d0 = (void *)(*local_1c0 + local_1c0[8] * (long)local_200 * local_1c0[2]);
          local_d8 = local_1c0[2];
          local_dc = (undefined4)local_1c0[3];
          local_e8 = (long *)local_1c0[4];
          local_b8 = &local_248;
          local_240 = (int *)0x0;
          local_214 = 1;
          local_a8 = (long)local_bc * (long)local_c0 * local_d8;
          local_208 = (local_a8 + 0xfU & 0xfffffffffffffff0) / local_d8;
          local_220 = (int)local_1c0[5] + -1;
          if ((int)local_1c0[5] == 4) {
            local_208 = (long)*(int *)((long)local_1c0 + 0x2c) * (long)(int)local_1c0[6];
          }
          local_ac = 0x10;
          local_195 = 1;
          local_180 = &local_248;
          local_168 = &local_2a0;
          local_170 = local_1b8;
          local_f4 = *(int *)((long)local_1b8 + 0x2c);
          local_f8 = (int)local_1b8[6];
          local_fc = *(undefined4 *)((long)local_1b8 + 0x34);
          local_108 = (void *)(*local_1b8 + local_1b8[8] * (long)local_1fc * local_1b8[2]);
          local_110 = local_1b8[2];
          local_114 = (undefined4)local_1b8[3];
          local_120 = (long *)local_1b8[4];
          local_f0 = &local_2a0;
          local_298 = (int *)0x0;
          local_26c = 1;
          local_98 = (long)local_f4 * (long)local_f8 * local_110;
          local_9c = 0x10;
          local_260 = (local_98 + 0xfU & 0xfffffffffffffff0) / local_110;
          local_278 = (int)local_1b8[5] + -1;
          if ((int)local_1b8[5] == 4) {
            local_260 = (long)*(int *)((long)local_1b8 + 0x2c) * (long)(int)local_1b8[6];
          }
          local_175 = 1;
          local_160 = &local_2a0;
          local_194 = local_200;
          local_174 = local_1fc;
          local_2a0 = local_108;
          local_290 = local_110;
          local_288 = local_114;
          local_280 = local_120;
          local_274 = local_f4;
          local_270 = local_f8;
          local_268 = local_fc;
          local_248 = local_d0;
          local_238 = local_d8;
          local_230 = local_dc;
          local_228 = local_e8;
          local_21c = local_bc;
          local_218 = local_c0;
          local_210 = local_c4;
          memcpy(local_d0,local_108,local_1f0);
          local_148 = &local_2a0;
          local_58 = local_148;
          if (local_298 != (int *)0x0) {
            local_5c = 0xffffffff;
            LOCK();
            local_60 = *local_298;
            *local_298 = *local_298 + -1;
            UNLOCK();
            if (local_60 == 1) {
              if (local_280 == (long *)0x0) {
                local_20 = local_2a0;
                if (local_2a0 != (void *)0x0) {
                  free(local_2a0);
                }
              }
              else {
                (**(code **)(*local_280 + 0x18))(local_280,local_2a0);
              }
            }
          }
          local_2a0 = (void *)0x0;
          local_290 = 0;
          local_288 = 0;
          local_278 = 0;
          local_274 = 0;
          local_270 = 0;
          local_26c = 0;
          local_268 = 0;
          local_260 = 0;
          local_298 = (int *)0x0;
          local_138 = &local_248;
          local_78 = local_138;
          if (local_240 != (int *)0x0) {
            local_7c = 0xffffffff;
            LOCK();
            local_80 = *local_240;
            *local_240 = *local_240 + -1;
            UNLOCK();
            if (local_80 == 1) {
              if (local_228 == (long *)0x0) {
                local_10 = local_248;
                if (local_248 != (void *)0x0) {
                  free(local_248);
                }
              }
              else {
                (**(code **)(*local_228 + 0x18))(local_228,local_248);
              }
            }
          }
        }
      }
      local_1a4 = 0;
    }
  }
  else {
    local_1a4 = -100;
  }
  return local_1a4;
}

Assistant:

int ShuffleChannel::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0)
    {
        // reject invalid group
        return -100;
    }

    int _group = reverse ? channels / group : group;
    int channels_per_group = channels / _group;

    top_blob.create(w, h, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const size_t feature_sz = (size_t)w * h * elemsize;
    for (int i = 0; i < _group; i++)
    {
        for (int j = 0; j < channels_per_group; j++)
        {
            int src_q = channels_per_group * i + j;
            int dst_q = _group * j + i;
            memcpy(top_blob.channel(dst_q), bottom_blob.channel(src_q), feature_sz);
        }
    }

    return 0;
}